

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleTimeZone::setEndRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfWeekInMonth,int32_t dayOfWeek,
          int32_t time,TimeMode mode,UErrorCode *status)

{
  TimeMode mode_local;
  int32_t time_local;
  int32_t dayOfWeek_local;
  int32_t dayOfWeekInMonth_local;
  int32_t month_local;
  SimpleTimeZone *this_local;
  
  this->endMonth = (int8_t)month;
  this->endDay = (int8_t)dayOfWeekInMonth;
  this->endDayOfWeek = (int8_t)dayOfWeek;
  this->endTime = time;
  this->endTimeMode = mode;
  decodeEndRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void
SimpleTimeZone::setEndRule(int32_t month, int32_t dayOfWeekInMonth, int32_t dayOfWeek,
                           int32_t time, TimeMode mode, UErrorCode& status)
{
    endMonth     = (int8_t)month;
    endDay       = (int8_t)dayOfWeekInMonth;
    endDayOfWeek = (int8_t)dayOfWeek;
    endTime      = time;
    endTimeMode  = mode;
    decodeEndRule(status);
    transitionRulesInitialized = FALSE;
}